

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O0

void cmVariableWatchCommandVariableAccessed
               (string *variable,int access_type,void *client_data,char *newValue,cmMakefile *mf)

{
  long *this;
  undefined8 this_00;
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  ostream *poVar4;
  char *local_6d8;
  char *local_658;
  string local_5e8;
  undefined1 local_5c8 [8];
  ostringstream msg;
  string local_448 [32];
  undefined1 local_428 [8];
  ostringstream error;
  cmExecutionStatus local_2ac;
  undefined1 local_2a8 [4];
  cmExecutionStatus status;
  allocator local_271;
  string local_270;
  cmListFileArgument local_250;
  allocator local_219;
  string local_218;
  cmListFileArgument local_1f8;
  allocator local_1c1;
  string local_1c0;
  cmListFileArgument local_1a0;
  cmListFileArgument local_170;
  allocator local_13a;
  allocator local_139;
  string local_138;
  undefined1 local_118 [8];
  string stack;
  cmMakefile *makefile;
  string local_e8;
  char *local_c8;
  char *currentListFile;
  char *accessString;
  bool processed;
  undefined1 local_a8 [8];
  cmListFileArgument arg;
  cmListFileFunction newLFF;
  cmVariableWatchCallbackData *data;
  cmMakefile *mf_local;
  char *newValue_local;
  void *client_data_local;
  int access_type_local;
  string *variable_local;
  
  if ((*client_data & 1) != 0) {
    return;
  }
  *(undefined1 *)client_data = 1;
  newLFF.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)client_data;
  cmListFileFunction::cmListFileFunction((cmListFileFunction *)&arg.Line);
  cmListFileArgument::cmListFileArgument((cmListFileArgument *)local_a8);
  accessString._3_1_ = 0;
  currentListFile = cmVariableWatch::GetAccessAsString(access_type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e8,"CMAKE_CURRENT_LIST_FILE",(allocator *)((long)&makefile + 7));
  pcVar2 = cmMakefile::GetDefinition(mf,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&makefile + 7));
  stack.field_2._8_8_ = mf;
  local_c8 = pcVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"LISTFILE_STACK",&local_139);
  pcVar2 = cmMakefile::GetProperty(mf,&local_138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_118,pcVar2,&local_13a);
  std::allocator<char>::~allocator((allocator<char> *)&local_13a);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    this = &newLFF.super_cmCommandContext.Line;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::clear
              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)this);
    cmListFileArgument::cmListFileArgument(&local_170,variable,Quoted,9999);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)this,&local_170);
    cmListFileArgument::~cmListFileArgument(&local_170);
    pcVar2 = currentListFile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1c0,pcVar2,&local_1c1);
    cmListFileArgument::cmListFileArgument(&local_1a0,&local_1c0,Quoted,9999);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
               &newLFF.super_cmCommandContext.Line,&local_1a0);
    cmListFileArgument::~cmListFileArgument(&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    local_658 = newValue;
    if (newValue == (char *)0x0) {
      local_658 = "";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_218,local_658,&local_219);
    cmListFileArgument::cmListFileArgument(&local_1f8,&local_218,Quoted,9999);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
               &newLFF.super_cmCommandContext.Line,&local_1f8);
    cmListFileArgument::~cmListFileArgument(&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    pcVar2 = local_c8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_270,pcVar2,&local_271);
    cmListFileArgument::cmListFileArgument(&local_250,&local_270,Quoted,9999);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
               &newLFF.super_cmCommandContext.Line,&local_250);
    cmListFileArgument::~cmListFileArgument(&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    cmListFileArgument::cmListFileArgument
              ((cmListFileArgument *)local_2a8,(string *)local_118,Quoted,9999);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
               &newLFF.super_cmCommandContext.Line,(value_type *)local_2a8);
    cmListFileArgument::~cmListFileArgument((cmListFileArgument *)local_2a8);
    std::__cxx11::string::operator=
              ((string *)&arg.Line,
               (string *)
               &((newLFF.Arguments.
                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage)->Value)._M_string_length);
    newLFF.super_cmCommandContext.Name.field_2._8_8_ = 9999;
    cmExecutionStatus::cmExecutionStatus(&local_2ac);
    bVar1 = cmMakefile::ExecuteCommand
                      ((cmMakefile *)stack.field_2._8_8_,(cmListFileFunction *)&arg.Line,&local_2ac)
    ;
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
      poVar4 = std::operator<<((ostream *)local_428,"Error in cmake code at\nUnknown:0:\n");
      poVar4 = std::operator<<(poVar4,"A command failed during the invocation of callback \"");
      poVar4 = std::operator<<(poVar4,(string *)
                                      &((newLFF.Arguments.
                                         super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->Value)
                                       ._M_string_length);
      std::operator<<(poVar4,"\".");
      std::__cxx11::ostringstream::str();
      pcVar2 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error(pcVar2,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string(local_448);
      ((newLFF.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage)->Value)._M_dataplus = (_Alloc_hider)0x0;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
      goto LAB_00632468;
    }
    accessString._3_1_ = 1;
  }
  if ((accessString._3_1_ & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c8);
    poVar4 = std::operator<<((ostream *)local_5c8,"Variable \"");
    poVar4 = std::operator<<(poVar4,(string *)variable);
    poVar4 = std::operator<<(poVar4,"\" was accessed using ");
    poVar4 = std::operator<<(poVar4,currentListFile);
    poVar4 = std::operator<<(poVar4," with value \"");
    local_6d8 = newValue;
    if (newValue == (char *)0x0) {
      local_6d8 = "";
    }
    poVar4 = std::operator<<(poVar4,local_6d8);
    std::operator<<(poVar4,"\".");
    this_00 = stack.field_2._8_8_;
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage((cmMakefile *)this_00,LOG,&local_5e8);
    std::__cxx11::string::~string((string *)&local_5e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c8);
  }
  ((newLFF.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage)->Value)._M_dataplus = (_Alloc_hider)0x0;
LAB_00632468:
  std::__cxx11::string::~string((string *)local_118);
  cmListFileArgument::~cmListFileArgument((cmListFileArgument *)local_a8);
  cmListFileFunction::~cmListFileFunction((cmListFileFunction *)&arg.Line);
  return;
}

Assistant:

static void cmVariableWatchCommandVariableAccessed(const std::string& variable,
                                                   int access_type,
                                                   void* client_data,
                                                   const char* newValue,
                                                   const cmMakefile* mf)
{
  cmVariableWatchCallbackData* data =
    static_cast<cmVariableWatchCallbackData*>(client_data);

  if (data->InCallback) {
    return;
  }
  data->InCallback = true;

  cmListFileFunction newLFF;
  cmListFileArgument arg;
  bool processed = false;
  const char* accessString = cmVariableWatch::GetAccessAsString(access_type);
  const char* currentListFile = mf->GetDefinition("CMAKE_CURRENT_LIST_FILE");

  /// Ultra bad!!
  cmMakefile* makefile = const_cast<cmMakefile*>(mf);

  std::string stack = makefile->GetProperty("LISTFILE_STACK");
  if (!data->Command.empty()) {
    newLFF.Arguments.clear();
    newLFF.Arguments.push_back(
      cmListFileArgument(variable, cmListFileArgument::Quoted, 9999));
    newLFF.Arguments.push_back(
      cmListFileArgument(accessString, cmListFileArgument::Quoted, 9999));
    newLFF.Arguments.push_back(cmListFileArgument(
      newValue ? newValue : "", cmListFileArgument::Quoted, 9999));
    newLFF.Arguments.push_back(
      cmListFileArgument(currentListFile, cmListFileArgument::Quoted, 9999));
    newLFF.Arguments.push_back(
      cmListFileArgument(stack, cmListFileArgument::Quoted, 9999));
    newLFF.Name = data->Command;
    newLFF.Line = 9999;
    cmExecutionStatus status;
    if (!makefile->ExecuteCommand(newLFF, status)) {
      std::ostringstream error;
      error << "Error in cmake code at\nUnknown:0:\n"
            << "A command failed during the invocation of callback \""
            << data->Command << "\".";
      cmSystemTools::Error(error.str().c_str());
      data->InCallback = false;
      return;
    }
    processed = true;
  }
  if (!processed) {
    std::ostringstream msg;
    msg << "Variable \"" << variable << "\" was accessed using "
        << accessString << " with value \"" << (newValue ? newValue : "")
        << "\".";
    makefile->IssueMessage(cmake::LOG, msg.str());
  }

  data->InCallback = false;
}